

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O0

int __thiscall pstore::romfs::romfs::stat(romfs *this,char *__file,stat *__buf)

{
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> local_40;
  char *local_20;
  romfs *this_local;
  not_null<const_char_*> path_local;
  
  local_20 = __file;
  this_local = (romfs *)__buf;
  path_local.ptr_ = (char *)this;
  parse_path(&local_40,(romfs *)__file,(not_null<const_char_*>)__buf);
  pstore::operator>>=(this,&local_40);
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::~error_or(&local_40);
  return (int)this;
}

Assistant:

error_or<struct stat> romfs::stat (not_null<czstring> const path) const {
            return this->parse_path (path) >>=
                   [] (dirent_ptr const de) { return error_or<struct stat>{de->stat ()}; };
        }